

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void goodform::json::write_string(string *input,ostream *output)

{
  char cVar1;
  char *pcVar2;
  unsigned_long i;
  ulong uVar3;
  
  std::operator<<(output,"\"");
  uVar3 = 0;
  do {
    if (input->_M_string_length <= uVar3) {
      std::operator<<(output,"\"");
      return;
    }
    cVar1 = (input->_M_dataplus)._M_p[uVar3];
    switch(cVar1) {
    case '\b':
      pcVar2 = "\\b";
      break;
    case '\t':
      pcVar2 = "\\t";
      break;
    case '\n':
      pcVar2 = "\\n";
      break;
    case '\v':
switchD_00136d7f_caseD_b:
      std::operator<<(output,cVar1);
      goto LAB_00136df8;
    case '\f':
      pcVar2 = "\\f";
      break;
    case '\r':
      pcVar2 = "\\r";
      break;
    default:
      if (cVar1 == '\"') {
        pcVar2 = "\\\"";
      }
      else if (cVar1 == '/') {
        pcVar2 = "\\/";
      }
      else {
        if (cVar1 != '\\') goto switchD_00136d7f_caseD_b;
        pcVar2 = "\\\\";
      }
    }
    std::operator<<(output,pcVar2);
LAB_00136df8:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void json::write_string(const std::string& input, std::ostream& output)
  {
    output << "\"";
    for (unsigned long i = 0; i < input.length(); ++i)
    {
      char c = input[i];
      if (c == '\\')
        output << "\\\\";
      else if (c == '/')
        output << "\\/";
      else if (c == '"')
        output << "\\\"";
      else if (c == '\b')
        output << "\\b";
      else if (c == '\f')
        output << "\\f";
      else if (c == '\n')
        output << "\\n";
      else if (c == '\r')
        output << "\\r";
      else if (c == '\t')
        output << "\\t";
      else
        output << c;
    }
    output << "\"";
  }